

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

optional<real_token> *
read_real(optional<real_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_type __rlen;
  double dVar5;
  undefined1 auVar6 [16];
  undefined8 extraout_XMM0_Qb;
  optional<double> oVar7;
  
  if (buf_1._M_len == 1) {
    iVar3 = bcmp(buf_1._M_str,"-",1);
    if (iVar3 == 0) {
      oVar7 = read_real(buf_2);
      if (((undefined1  [16])
           oVar7.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar4 = 1;
        dVar5 = -1.0;
      }
      else {
        auVar6._8_8_ = 0x8000000000000000;
        auVar6._0_8_ = 0x8000000000000000;
        auVar1._8_8_ = extraout_XMM0_Qb;
        auVar1._0_8_ = oVar7.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
        auVar6 = vxorpd_avx512vl(auVar1,auVar6);
        dVar5 = auVar6._0_8_;
        uVar4 = 2;
      }
      goto LAB_0013a351;
    }
    iVar3 = bcmp(buf_1._M_str,"+",1);
    if (iVar3 == 0) {
      oVar7 = read_real(buf_2);
      bVar2 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged;
      dVar5 = (double)((ulong)(bVar2 & 1) *
                       (long)oVar7.super__Optional_base<double,_true,_true>._M_payload.
                             super__Optional_payload_base<double>._M_payload +
                      (ulong)!(bool)(bVar2 & 1) * 0x3ff0000000000000);
      uVar4 = (bVar2 & 1) + 1;
      goto LAB_0013a351;
    }
  }
  oVar7 = read_real(buf_1);
  bVar2 = (bool)(oVar7.super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_engaged & 1);
  uVar4 = (uint)bVar2;
  dVar5 = (double)((ulong)bVar2 *
                   (long)oVar7.super__Optional_base<double,_true,_true>._M_payload.
                         super__Optional_payload_base<double>._M_payload +
                  (ulong)!bVar2 * 0x3ff0000000000000);
LAB_0013a351:
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_payload._M_value.value = dVar5;
  *(uint *)((long)&(__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload
                   .super__Optional_payload_base<real_token>._M_payload + 8) = uVar4;
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<real_token>
read_real(const std::string_view buf_1, const std::string_view buf_2) noexcept
{
    std::optional<double> value_opt;

    if (buf_1 == "-") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(-1.0, 1);
        else
            return real_token(-1.0 * *value_opt, 2);
    }

    if (buf_1 == "+") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(1.0, 1);
        else
            return real_token(*value_opt, 2);
    }

    value_opt = read_real(buf_1);
    if (!value_opt)
        return real_token(1.0, 0);

    return real_token(*value_opt, 1);
}